

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr xmlXPathObjectCopy(xmlXPathObjectPtr val)

{
  xmlGenericErrorFunc p_Var1;
  undefined4 uVar2;
  xmlXPathObjectPtr pxVar3;
  xmlNodeSetPtr pxVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  xmlChar *pxVar7;
  xmlLocationSetPtr pxVar8;
  long lVar9;
  xmlXPathObjectPtr pxVar10;
  xmlXPathObjectPtr pxVar11;
  byte bVar12;
  
  bVar12 = 0;
  if (val == (xmlXPathObjectPtr)0x0) {
    return (xmlXPathObjectPtr)0x0;
  }
  pxVar3 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
  if (pxVar3 == (xmlXPathObjectPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"copying object\n");
    return (xmlXPathObjectPtr)0x0;
  }
  pxVar10 = val;
  pxVar11 = pxVar3;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    uVar2 = *(undefined4 *)&pxVar10->field_0x4;
    pxVar11->type = pxVar10->type;
    *(undefined4 *)&pxVar11->field_0x4 = uVar2;
    pxVar10 = (xmlXPathObjectPtr)((long)pxVar10 + (ulong)bVar12 * -0x10 + 8);
    pxVar11 = (xmlXPathObjectPtr)((long)pxVar11 + (ulong)bVar12 * -0x10 + 8);
  }
  switch(val->type) {
  case XPATH_UNDEFINED:
    pp_Var5 = __xmlGenericError();
    p_Var1 = *pp_Var5;
    ppvVar6 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar6,"xmlXPathObjectCopy: unsupported type %d\n",(ulong)val->type);
    break;
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    pxVar4 = xmlXPathNodeSetMerge((xmlNodeSetPtr)0x0,val->nodesetval);
    pxVar3->nodesetval = pxVar4;
    pxVar3->boolval = 0;
    break;
  case XPATH_STRING:
    pxVar7 = xmlStrdup(val->stringval);
    pxVar3->stringval = pxVar7;
    break;
  case XPATH_LOCATIONSET:
    pxVar8 = xmlXPtrLocationSetMerge((xmlLocationSetPtr)0x0,(xmlLocationSetPtr)val->user);
    goto LAB_001de687;
  case XPATH_USERS:
    pxVar8 = (xmlLocationSetPtr)val->user;
LAB_001de687:
    pxVar3->user = pxVar8;
  }
  return pxVar3;
}

Assistant:

xmlXPathObjectPtr
xmlXPathObjectCopy(xmlXPathObjectPtr val) {
    xmlXPathObjectPtr ret;

    if (val == NULL)
	return(NULL);

    ret = (xmlXPathObjectPtr) xmlMalloc(sizeof(xmlXPathObject));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "copying object\n");
	return(NULL);
    }
    memcpy(ret, val , (size_t) sizeof(xmlXPathObject));
#ifdef XP_DEBUG_OBJ_USAGE
    xmlXPathDebugObjUsageRequested(NULL, val->type);
#endif
    switch (val->type) {
	case XPATH_BOOLEAN:
	case XPATH_NUMBER:
	case XPATH_POINT:
	case XPATH_RANGE:
	    break;
	case XPATH_STRING:
	    ret->stringval = xmlStrdup(val->stringval);
	    break;
	case XPATH_XSLT_TREE:
#if 0
/*
  Removed 11 July 2004 - the current handling of xslt tmpRVT nodes means that
  this previous handling is no longer correct, and can cause some serious
  problems (ref. bug 145547)
*/
	    if ((val->nodesetval != NULL) &&
		(val->nodesetval->nodeTab != NULL)) {
		xmlNodePtr cur, tmp;
		xmlDocPtr top;

		ret->boolval = 1;
		top =  xmlNewDoc(NULL);
		top->name = (char *)
		    xmlStrdup(val->nodesetval->nodeTab[0]->name);
		ret->user = top;
		if (top != NULL) {
		    top->doc = top;
		    cur = val->nodesetval->nodeTab[0]->children;
		    while (cur != NULL) {
			tmp = xmlDocCopyNode(cur, top, 1);
			xmlAddChild((xmlNodePtr) top, tmp);
			cur = cur->next;
		    }
		}

		ret->nodesetval = xmlXPathNodeSetCreate((xmlNodePtr) top);
	    } else
		ret->nodesetval = xmlXPathNodeSetCreate(NULL);
	    /* Deallocate the copied tree value */
	    break;
#endif
	case XPATH_NODESET:
            /* TODO: Check memory error. */
	    ret->nodesetval = xmlXPathNodeSetMerge(NULL, val->nodesetval);
	    /* Do not deallocate the copied tree value */
	    ret->boolval = 0;
	    break;
	case XPATH_LOCATIONSET:
#ifdef LIBXML_XPTR_ENABLED
	{
	    xmlLocationSetPtr loc = val->user;
	    ret->user = (void *) xmlXPtrLocationSetMerge(NULL, loc);
	    break;
	}
#endif
        case XPATH_USERS:
	    ret->user = val->user;
	    break;
        case XPATH_UNDEFINED:
	    xmlGenericError(xmlGenericErrorContext,
		    "xmlXPathObjectCopy: unsupported type %d\n",
		    val->type);
	    break;
    }
    return(ret);
}